

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffc2s(char *instr,char *outstr,int *status)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  
  if (0 < *status) {
    return *status;
  }
  if (*instr == '\'') {
    sVar2 = strlen(instr);
    if (sVar2 < 2) {
      *outstr = '\0';
      if (sVar2 == 1) goto LAB_0013654a;
    }
    else {
      sVar4 = 1;
      uVar3 = 0;
      do {
        pcVar1 = instr + sVar4;
        if (*pcVar1 == '\'') {
          if (instr[sVar4 + 1] != '\'') break;
          sVar4 = sVar4 + 1;
        }
        outstr[uVar3] = *pcVar1;
        sVar4 = sVar4 + 1;
        uVar3 = uVar3 + 1;
      } while (sVar4 < sVar2);
      outstr[uVar3 & 0xffffffff] = '\0';
      if (sVar4 == sVar2) {
LAB_0013654a:
        ffxmsg(5,"This string value has no closing quote (ffc2s):");
        ffxmsg(5,instr);
        *status = 0xcd;
        return 0xcd;
      }
      if (0 < (int)uVar3) {
        uVar3 = (uVar3 & 0xffffffff) + 1;
        do {
          if (outstr[uVar3 - 2] != ' ') break;
          outstr[uVar3 - 2] = '\0';
          uVar3 = uVar3 - 1;
        } while (1 < uVar3);
      }
    }
  }
  else {
    if (*instr == '\0') {
      *outstr = '\0';
      *status = 0xcc;
      return 0xcc;
    }
    strcpy(outstr,instr);
  }
  return *status;
}

Assistant:

int ffc2s(const char *instr,  /* I - null terminated quoted input string */
          char *outstr,       /* O - null terminated output string without quotes */
          int *status)        /* IO - error status */
/*
    convert an input quoted string to an unquoted string by removing
    the leading and trailing quote character.  Also, replace any
    pairs of single quote characters with just a single quote 
    character (FITS used a pair of single quotes to represent
    a literal quote character within the string).
*/
{
    int jj;
    size_t len, ii;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (instr[0] != '\'')
    {
        if (instr[0] == '\0') {
           outstr[0] = '\0';
           return(*status = VALUE_UNDEFINED);  /* null value string */
        } else {
          strcpy(outstr, instr);  /* no leading quote, so return input string */
          return(*status);
        }
    }

    len = strlen(instr);

    for (ii=1, jj=0; ii < len; ii++, jj++)
    {
        if (instr[ii] == '\'')  /*  is this the closing quote?  */
        {
            if (instr[ii+1] == '\'')  /* 2 successive quotes? */
                ii++;  /* copy only one of the quotes */
            else
                break;   /*  found the closing quote, so exit this loop  */
        }
        outstr[jj] = instr[ii];   /* copy the next character to the output */
    }

    outstr[jj] = '\0';             /*  terminate the output string  */

    if (ii == len)
    {
        ffpmsg("This string value has no closing quote (ffc2s):");
        ffpmsg(instr);
        return(*status = 205);
    }

    for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
    {
        if (outstr[jj] == ' ')
            outstr[jj] = 0;
        else
            break;
    }

    return(*status);
}